

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  char cVar2;
  numpunct *pnVar3;
  basic_appender<char> bVar4;
  undefined8 uVar5;
  ulong uVar6;
  int **ppiVar7;
  buffer<char> *buf;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  int num_zeros;
  undefined1 local_d6 [2];
  bool local_d4 [4];
  int local_d0;
  undefined1 local_cc [12];
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  format_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  decimal_fp<float> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  undefined1 *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_cc._0_4_ = f->significand;
  uVar12 = 0x1f;
  if ((local_cc._0_4_ | 1) != 0) {
    for (; (local_cc._0_4_ | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  local_d0 = (int)((ulong)(uint)local_cc._0_4_ +
                   *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar12 * 8) >> 0x20);
  uVar6 = (ulong)((local_d0 + 1) - (uint)(s == none));
  local_d6[1] = '0';
  cVar2 = '.';
  local_cc._4_4_ = s;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    local_78 = f;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_c0);
    }
    else {
      std::locale::locale((locale *)local_c0,(locale *)loc.locale_);
    }
    pnVar3 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_c0);
    cVar2 = (**(code **)(*(long *)pnVar3 + 0x10))(pnVar3);
    std::locale::~locale((locale *)local_c0);
    f = local_78;
  }
  uVar5 = local_b0._M_allocated_capacity;
  uVar12 = f->exponent;
  local_cc._8_4_ = local_d0 + uVar12;
  uVar1 = (specs->super_basic_specs).data_;
  iVar13 = specs->precision;
  bVar9 = (byte)uVar1 & 7;
  local_d6[0] = cVar2;
  if (bVar9 != 1) {
    if ((uVar1 & 7) == 2) {
LAB_0013d944:
      if ((int)uVar12 < 0) {
        if ((int)local_cc._8_4_ < 1) {
          local_70._M_allocated_capacity._0_4_ = -local_cc._8_4_;
          if ((local_d0 == 0) &&
             (SBORROW4(iVar13,-local_cc._8_4_) != iVar13 + local_cc._8_4_ < 0 && -1 < iVar13)) {
            local_70._M_allocated_capacity._0_4_ = iVar13;
          }
          uVar12 = 1;
          if (local_d0 == 0 && local_70._M_allocated_capacity._0_4_ == 0) {
            uVar12 = uVar1 >> 0xd & 1;
          }
          local_c0._8_8_ = local_d4;
          local_d4[0] = (bool)(char)uVar12;
          sVar15 = uVar6 + (local_70._M_allocated_capacity._0_4_ + uVar12 + 1);
          local_c0._0_8_ = local_cc + 4;
          local_b0._M_allocated_capacity = (size_type)local_d6;
          local_b0._8_8_ = &local_70;
          local_a0._M_p = local_d6 + 1;
          local_98 = (format_specs *)local_cc;
          local_90._M_allocated_capacity = (size_type)&local_d0;
          bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                            (out,specs,sVar15,sVar15,(anon_class_56_7_88befd79 *)local_c0);
          return (basic_appender<char>)bVar4.container;
        }
        uVar12 = iVar13 - local_d0 & (int)(uVar1 << 0x12) >> 0x1f;
        local_d4 = (bool  [4])uVar12;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        iVar13 = 0;
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        sVar15 = uVar12 + uVar6;
        ppiVar7 = (int **)local_c0._0_8_;
        do {
          iVar8 = 0x7fffffff;
          if (local_98 != (format_specs *)0x0) {
            if (ppiVar7 == (int **)(local_c0._8_8_ + local_c0._0_8_)) {
              uVar12 = (uint)(char)*(byte *)((long)(local_c0._8_8_ + local_c0._0_8_) + -1);
            }
            else {
              bVar9 = *(byte *)ppiVar7;
              if ((byte)(bVar9 + 0x81) < 0x82) goto LAB_0013dc09;
              ppiVar7 = (int **)((long)ppiVar7 + 1);
              uVar12 = (uint)bVar9;
            }
            iVar13 = iVar13 + uVar12;
            iVar8 = iVar13;
          }
LAB_0013dc09:
          sVar15 = sVar15 + 1;
        } while (iVar8 < (int)local_cc._8_4_);
        local_70._M_allocated_capacity = (size_type)(local_cc + 4);
        local_70._8_8_ = local_cc;
        local_60 = &local_d0;
        local_58 = local_cc + 8;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_d6;
        local_40._M_allocated_capacity = (size_type)local_d4;
        local_40._8_8_ = local_d6 + 1;
        local_48 = (digit_grouping<char> *)local_c0;
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                          (out,specs,sVar15,sVar15,(anon_class_64_8_085c650e *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_p != &local_90) {
          operator_delete(local_a0._M_p,(ulong)(local_90._M_allocated_capacity + 1));
        }
        uVar5 = local_b0._M_allocated_capacity;
        uVar11 = local_c0._0_8_;
        if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
          return (basic_appender<char>)bVar4.container;
        }
      }
      else {
        lVar14 = uVar6 + uVar12;
        local_d4 = (bool  [4])(iVar13 - local_cc._8_4_);
        if ((uVar1 >> 0xd & 1) != 0) {
          if (bVar9 != 2 && (int)local_d4 < 1) {
            local_d4[0] = false;
            local_d4[1] = false;
            local_d4[2] = false;
            local_d4[3] = false;
          }
          lVar14 = lVar14 + 1;
          if (0 < (long)(int)local_d4) {
            lVar14 = lVar14 + (int)local_d4;
          }
        }
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        sVar15 = lVar14 - 1;
        iVar13 = 0;
        uVar5 = local_70._M_allocated_capacity;
        do {
          iVar8 = 0x7fffffff;
          if (local_48 != (digit_grouping<char> *)0x0) {
            if ((int **)uVar5 == (int **)(local_70._8_8_ + local_70._M_allocated_capacity)) {
              uVar12 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._M_allocated_capacity)
                                            + -1);
            }
            else {
              bVar9 = *(byte *)uVar5;
              if ((byte)(bVar9 + 0x81) < 0x82) goto LAB_0013d9e9;
              uVar5 = uVar5 + 1;
              uVar12 = (uint)bVar9;
            }
            iVar13 = iVar13 + uVar12;
            iVar8 = iVar13;
          }
LAB_0013d9e9:
          sVar15 = sVar15 + 1;
        } while (iVar8 < (int)local_cc._8_4_);
        local_c0._0_8_ = local_cc + 4;
        local_c0._8_8_ = local_cc;
        local_b0._M_allocated_capacity = (size_type)&local_d0;
        local_90._M_allocated_capacity = (size_type)local_d6;
        local_90._8_8_ = local_d4;
        local_80 = local_d6 + 1;
        local_b0._8_8_ = f;
        local_a0._M_p = (pointer)&local_70;
        local_98 = specs;
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                          (out,specs,sVar15,sVar15,(anon_class_72_9_eb40e20e *)local_c0);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
        }
        uVar5 = local_60;
        uVar11 = local_70._M_allocated_capacity;
        if ((int **)local_70._M_allocated_capacity == &local_60) {
          return (basic_appender<char>)bVar4.container;
        }
      }
      operator_delete((void *)uVar11,uVar5 + 1);
      return (basic_appender<char>)bVar4.container;
    }
    if (-4 < (int)local_cc._8_4_) {
      if (0 < iVar13) {
        exp_upper = iVar13;
      }
      if ((int)local_cc._8_4_ <= exp_upper) goto LAB_0013d944;
    }
  }
  iVar8 = uVar12 + local_d0 + -1;
  if ((uVar1 >> 0xd & 1) == 0) {
    uVar10 = 0;
    if (local_d0 == 1) {
      local_d6[0] = '\0';
    }
  }
  else {
    uVar10 = 0;
    if (0 < iVar13 - local_d0) {
      uVar10 = (ulong)(uint)(iVar13 - local_d0);
    }
    uVar6 = uVar6 + uVar10;
  }
  iVar13 = 1 - local_cc._8_4_;
  if (0 < (int)local_cc._8_4_) {
    iVar13 = iVar8;
  }
  lVar14 = 2;
  if (99 < iVar13) {
    lVar14 = (ulong)(999 < iVar13) + 3;
  }
  sVar15 = (3 - (ulong)(local_d6[0] == '\0')) + lVar14 + uVar6;
  local_c0._4_4_ = local_cc._0_4_;
  local_c0._0_4_ = local_cc._4_4_;
  local_c0[0xc] = local_d6[0];
  local_c0._8_4_ = local_d0;
  local_b0._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar10);
  local_b0._M_allocated_capacity._6_2_ = SUB82(uVar5,6);
  local_b0._M_allocated_capacity =
       CONCAT26(local_b0._M_allocated_capacity._6_2_,
                CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,local_b0._M_allocated_capacity._0_5_)) |
       0x450000000000;
  local_b0._8_4_ = iVar8;
  if (specs->width < 1) {
    uVar6 = sVar15 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar6) {
      (*(out.container)->grow_)(out.container,uVar6);
    }
    bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_28_8_ce6b8c4d::operator()
                      ((anon_class_28_8_ce6b8c4d *)local_c0,out.container);
  }
  else {
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,sVar15,sVar15,(anon_class_28_8_ce6b8c4d *)local_c0);
  }
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}